

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void util_makepath(char *path)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  char *pcVar5;
  uint *puVar6;
  void *pvVar7;
  ulong in_RCX;
  ulong extraout_RDX;
  ulong *in_RSI;
  ulong uVar8;
  
  if ((path != (char *)0x0) && (*path != '/')) {
    in_RSI = (ulong *)strdup(path);
    pcVar5 = strchr((char *)in_RSI,0x2f);
    do {
      if (pcVar5 == (char *)0x0) {
        free(in_RSI);
        return;
      }
      *pcVar5 = '\0';
      iVar4 = mkdir((char *)in_RSI,0x1ff);
      if (iVar4 == -1) {
        puVar6 = (uint *)__errno_location();
        path = (char *)(ulong)*puVar6;
        if (*puVar6 != 0x11) {
          util_makepath_cold_1();
          break;
        }
      }
      *pcVar5 = '/';
      pcVar5 = strchr(pcVar5 + 1,0x2f);
    } while( true );
  }
  util_makepath_cold_2();
  uVar1 = *in_RSI;
  if (uVar1 < extraout_RDX) {
    uVar8 = uVar1 + (uVar1 == 0);
    if (1 < extraout_RDX) {
      do {
        uVar8 = uVar8 * 2;
        if (uVar8 < uVar1) {
          uVar8 = extraout_RDX;
        }
      } while (uVar8 < extraout_RDX);
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar8;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = in_RCX;
    if ((SUB168(auVar2 * auVar3,8) == 0) &&
       (pvVar7 = realloc(*(void **)path,in_RCX * uVar8), pvVar7 != (void *)0x0)) {
      *(void **)path = pvVar7;
      *in_RSI = uVar8;
    }
  }
  return;
}

Assistant:

void
util_makepath(
    const char* path)
{
    char* name;
    char* filename;

    /* TODO: Implement something like this for Windows. */
    if (!path || path[0] == '/') {
        fprintf(stderr, "%s: invalid path: %s\n", argv0, path);
        abort();
    }

    name = strdup(path);
    filename = name;

    for (;;) {
        filename = strchr(filename, '/');
        if (!filename)
            break;
        *filename = '\0';

#ifdef _WIN32
        if (CreateDirectory(name, NULL) == 0 && GetLastError() != ERROR_ALREADY_EXISTS) {
            fprintf(stderr, "%s: couldn't create directory %s\n",
                argv0, name);
            abort();
        }
#else
        if (mkdir(name, 0777) == -1
#ifdef EEXIST
            && errno != EEXIST
#endif
            ) {
            fprintf(stderr, "%s: couldn't create directory %s: %s\n",
                argv0, name, strerror(errno));
            abort();
        }
#endif

        *filename = '/';
        ++filename;
    }

    free(name);
}